

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void cppurses::detail::Screen::basic_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  _Hash_node_base *p_Var1;
  Glyph local_30;
  
  cover_leftovers(widg,staged_tiles);
  p_Var1 = (staged_tiles->_M_h)._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_30.symbol = *(wchar_t *)&p_Var1[3]._M_nxt;
      local_30.brush.attributes_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)p_Var1[4]._M_nxt;
      local_30.brush.background_color_.initialized_ = *(char *)&p_Var1[5]._M_nxt == '\x01';
      if (local_30.brush.background_color_.initialized_) {
        local_30.brush.background_color_.storage_.data_ =
             *(uchar (*) [2])((long)&p_Var1[5]._M_nxt + 2);
      }
      local_30.brush.foreground_color_.initialized_ =
           *(char *)((long)&p_Var1[5]._M_nxt + 4) == '\x01';
      if (local_30.brush.foreground_color_.initialized_) {
        local_30.brush.foreground_color_.storage_.data_ =
             *(uchar (*) [2])((long)&p_Var1[5]._M_nxt + 6);
      }
      basic_paint_single_point(widg,(Point *)(p_Var1 + 1),&local_30);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Screen::basic_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    cover_leftovers(widg, staged_tiles);
    for (const auto& point_tile : staged_tiles) {
        basic_paint_single_point(widg, point_tile.first, point_tile.second);
    }
}